

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_staj_visitor<char>::visit_typed_array
          (void *param_1,span<const_unsigned_short,_18446744073709551615UL> *param_2,
          undefined8 param_3,undefined8 param_4,typed_array_view *param_5)

{
  error_code *ec;
  size_type size;
  semantic_tag in_stack_ffffffffffffffbf;
  anon_union_8_10_502707a4_for_data_ in_stack_ffffffffffffffc0;
  typed_array_view *in_stack_ffffffffffffffc8;
  
  *(undefined4 *)((long)param_1 + 0x28) = 1;
  ec = (error_code *)detail::span<const_unsigned_short,_18446744073709551615UL>::data(param_2);
  size = detail::span<const_unsigned_short,_18446744073709551615UL>::size(param_2);
  typed_array_view::typed_array_view
            ((typed_array_view *)&stack0xffffffffffffffb8,(uint16_t *)ec,size);
  typed_array_view::operator=(param_5,in_stack_ffffffffffffffc8);
  ((ser_context *)((long)param_1 + 0x58))->_vptr_ser_context = (_func_int **)0x0;
  basic_json_visitor<char>::begin_array
            ((basic_json_visitor<char> *)in_stack_ffffffffffffffc0.uint64_data_,
             in_stack_ffffffffffffffbf,(ser_context *)param_1,ec);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(half_arg_t, const jsoncons::span<const uint16_t>& data, 
        semantic_tag tag,
        const ser_context& context,
        std::error_code& ec) override
    {
        state_ = staj_cursor_state::typed_array;
        data_ = typed_array_view(data.data(), data.size());
        index_ = 0;
        this->begin_array(tag, context, ec);
        JSONCONS_VISITOR_RETURN;
    }